

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

int mk_node(dtree_node_t *node,uint32 node_id,uint32 *id,uint32 n_id,float32 ****mixw,
           float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,uint32 n_state,
           uint32 n_stream,uint32 n_density,float32 *stwt,float32 mwfloor)

{
  double dVar1;
  uint uVar2;
  float *pfVar3;
  float32 *pfVar4;
  int iVar5;
  uint uVar6;
  cmd_ln_t *pcVar7;
  char *__s1;
  float32 ***pppfVar8;
  void *tmpptr;
  void *ptr;
  ulong uVar9;
  uint32 *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float32 *pfVar14;
  ulong d2;
  float32 *pfVar15;
  ulong uVar16;
  ulong uVar17;
  ulong d3;
  float fVar18;
  double dVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float32 fVar23;
  float32 ***local_98;
  float32 ***local_90;
  double local_80;
  
  pcVar7 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar7,"-ts2cbfn");
  iVar5 = strcmp(__s1,".semi.");
  if ((iVar5 != 0) && (iVar5 = strcmp(__s1,".cont."), iVar5 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
            ,0x326,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
LAB_0010d6db:
    exit(1);
  }
  iVar5 = strcmp(__s1,".cont.");
  d2 = (ulong)n_stream;
  uVar13 = (ulong)n_state;
  if (iVar5 == 0) {
    pcVar7 = cmd_ln_get();
    dVar19 = cmd_ln_float_r(pcVar7,"-varfloor");
    uVar6 = 0;
    for (uVar11 = 0; d2 != uVar11; uVar11 = uVar11 + 1) {
      uVar6 = uVar6 + veclen[uVar11];
    }
    fVar18 = (float)dVar19;
    local_90 = (float32 ***)
               __ckd_calloc_3d__(uVar13,d2,(ulong)uVar6,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                 ,0x331);
    local_98 = (float32 ***)
               __ckd_calloc_3d__(uVar13,d2,(ulong)uVar6,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                 ,0x332);
  }
  else {
    fVar18 = 0.0;
    local_90 = (float32 ***)0x0;
    local_98 = (float32 ***)0x0;
  }
  d3 = (ulong)n_density;
  pppfVar8 = (float32 ***)
             __ckd_calloc_3d__(uVar13,d2,d3,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                               ,0x335);
  tmpptr = __ckd_calloc_2d__(d2,d3,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                             ,0x336);
  ptr = __ckd_calloc__(d2,8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                       ,0x337);
  uVar11 = (ulong)n_id;
  uVar9 = 0;
  do {
    if (uVar9 == uVar13) {
      fVar18 = 0.0;
      uVar9 = 0;
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        if (fVar18 < (float)stwt[uVar12]) {
          uVar9 = uVar12 & 0xffffffff;
          fVar18 = (float)stwt[uVar12];
        }
      }
      fVar18 = 0.0;
      for (uVar12 = 0; d3 != uVar12; uVar12 = uVar12 + 1) {
        fVar18 = fVar18 + (float)(*pppfVar8[uVar9])[uVar12];
      }
      local_80 = 0.0;
      for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
        for (uVar12 = 0; uVar12 != d2; uVar12 = uVar12 + 1) {
          *(undefined8 *)((long)ptr + uVar12 * 8) = 0;
          dVar19 = 0.0;
          for (uVar16 = 0; d3 != uVar16; uVar16 = uVar16 + 1) {
            dVar19 = dVar19 + (double)(float)pppfVar8[uVar9][uVar12][uVar16];
            *(double *)((long)ptr + uVar12 * 8) = dVar19;
          }
        }
        dVar19 = 0.0;
        for (uVar12 = 0; uVar12 != d2; uVar12 = uVar12 + 1) {
          dVar1 = *(double *)((long)ptr + uVar12 * 8);
          if (iVar5 == 0) {
            dVar20 = (double)ent_cont(local_90[uVar9][uVar12],local_98[uVar9][uVar12],veclen[uVar12]
                                     );
          }
          else {
            for (uVar16 = 0; d3 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = (float)((double)(float)pppfVar8[uVar9][uVar12][uVar16] * (1.0 / dVar1));
              fVar23 = mwfloor;
              if ((float)mwfloor <= fVar21) {
                fVar23 = (float32)fVar21;
              }
              *(float32 *)(*(long *)((long)tmpptr + uVar12 * 8) + uVar16 * 4) = fVar23;
            }
            dVar20 = (double)ent_d(*(float32 **)((long)tmpptr + uVar12 * 8),n_density);
          }
          dVar19 = dVar19 + dVar1 * dVar20;
        }
        local_80 = local_80 + (double)(float)stwt[uVar9] * dVar19;
      }
      node->node_id = node_id;
      puVar10 = (uint32 *)
                __ckd_calloc__(uVar11,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                               ,0x38d);
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        puVar10[uVar13] = id[uVar13];
      }
      node->id = puVar10;
      node->n_id = n_id;
      node->mixw_occ = pppfVar8;
      if (iVar5 == 0) {
        node->means = local_90;
        node->vars = local_98;
      }
      node->occ = (float32)fVar18;
      node->wt_ent = (float64)local_80;
      ckd_free_2d(tmpptr);
      ckd_free(ptr);
      return 0;
    }
    for (uVar12 = 0; uVar12 != d2; uVar12 = uVar12 + 1) {
      if (iVar5 == 0) {
        pfVar14 = local_90[uVar9][uVar12];
        pfVar15 = local_98[uVar9][uVar12];
      }
      else {
        pfVar14 = (float32 *)0x0;
        pfVar15 = (float32 *)0x0;
      }
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        uVar6 = id[uVar16];
        for (uVar17 = 0; d3 != uVar17; uVar17 = uVar17 + 1) {
          pppfVar8[uVar9][uVar12][uVar17] =
               (float32)((float)mixw[uVar6][uVar9][uVar12][uVar17] +
                        (float)pppfVar8[uVar9][uVar12][uVar17]);
        }
        if (iVar5 == 0) {
          uVar2 = veclen[uVar12];
          for (uVar17 = 0; uVar2 != uVar17; uVar17 = uVar17 + 1) {
            pfVar3 = (float *)mixw[uVar6][uVar9][uVar12];
            pfVar4 = means[uVar6][uVar9][uVar12];
            pfVar14[uVar17] = (float32)(*pfVar3 * (float)pfVar4[uVar17] + (float)pfVar14[uVar17]);
            fVar21 = (float)pfVar4[uVar17];
            pfVar15[uVar17] =
                 (float32)((fVar21 * fVar21 + (float)vars[uVar6][uVar9][uVar12][uVar17]) * *pfVar3 +
                          (float)pfVar15[uVar17]);
          }
        }
      }
      if (iVar5 == 0) {
        pfVar3 = (float *)pppfVar8[uVar9][uVar12];
        uVar6 = veclen[uVar12];
        if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
          for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = (float)pfVar14[uVar16] / *pfVar3;
            pfVar14[uVar16] = (float32)fVar21;
            fVar22 = (float)pfVar15[uVar16] / *pfVar3 - fVar21 * fVar21;
            fVar21 = fVar18;
            if (fVar18 <= fVar22) {
              fVar21 = fVar22;
            }
            pfVar15[uVar16] = (float32)fVar21;
          }
        }
        else {
          for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = (float)pfVar14[uVar16];
            if ((fVar21 != 0.0) || (NAN(fVar21))) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                      ,0x35c,"denominator = 0, but numerator = %f at k = %d\n",(double)fVar21);
              goto LAB_0010d6db;
            }
          }
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int
mk_node(dtree_node_t *node,
	uint32 node_id,
	uint32 *id,
	uint32 n_id,
	float32 ****mixw,
        float32 ****means,
        float32 ****vars,
        uint32  *veclen,
	uint32 n_model,
	uint32 n_state,
	uint32 n_stream,
	uint32 n_density,
	float32 *stwt,
	float32 mwfloor)
{
    float32 ***mixw_occ, **dist;
    uint32 mm, m, s, j, k;
    float64 *dnom, norm, wt_ent, s_wt_ent, occ;
    float32 mx_wt;
    uint32 *l_id;
    float32 ***lmeans=0,***lvars=0;
    float32 varfloor=0;
    uint32 continuous, sumveclen;
    char*  type;

    type = (char *)cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else 
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Sumveclen is overallocation, but coding is simpler */
        for (j=0,sumveclen=0; j < n_stream; j++) sumveclen += veclen[j];

        lmeans   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        lvars   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    mixw_occ = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    dist     = (float32 **)ckd_calloc_2d(n_stream, n_density, sizeof(float32));
    dnom     = (float64 *)ckd_calloc(n_stream, sizeof(float64));

    /* Merge distributions of all the elements in a cluster for combined
       distribution */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
            float32 *lmeanvec=0, *lvarvec=0;
            if (continuous == 1) {
                lmeanvec = lmeans[s][j];
                lvarvec = lvars[s][j];
            }
	    for (mm = 0; mm < n_id; mm++) {
	        m = id[mm];
		for (k = 0; k < n_density; k++) {
		    mixw_occ[s][j][k] += mixw[m][s][j][k];
		}
                /* For continuous hmms we have only one gaussian per state */
                if (continuous == 1) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] += mixw[m][s][j][0] * means[m][s][j][k];
                        lvarvec[k] += mixw[m][s][j][0] * (vars[m][s][j][k] + 
                                        means[m][s][j][k] * means[m][s][j][k]);
	            }
	        }
	    }
            if (continuous == 1) {
                if (mixw_occ[s][j][0] != 0) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] /= mixw_occ[s][j][0];
                        lvarvec[k] = lvarvec[k]/mixw_occ[s][j][0] - 
                                            lmeanvec[k]*lmeanvec[k];
                        if (lvarvec[k] < varfloor) lvarvec[k] = varfloor;
	            }
	        }
                else {
                    for (k = 0; k < veclen[j]; k++) 
                        if (lmeanvec[k] != 0)
                            E_FATAL("denominator = 0, but numerator = %f at k = %d\n",lmeanvec[k],k);
                }
	    }
	}
    }

    /* Find out which state is under consideration */
    for (j = 0, mx_wt = 0, s = 0; s < n_state; s++) {
	if (stwt[s] > mx_wt) {
	    mx_wt = stwt[s];
	    j = s;
	}
    }

    /* occ is the same for each independent feature, so just choose 0 */
    for (k = 0, occ = 0; k < n_density; k++) {
	occ += mixw_occ[j][0][k];
    }

    for (s = 0, wt_ent = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0, dnom[j] = 0; k < n_density; k++) {
	        dnom[j] += mixw_occ[s][j][k];
	    }
	}

	for (j = 0, s_wt_ent = 0; j < n_stream; j++) {
	    norm = 1.0 / dnom[j];

            /* discrete_entropy for discrete case, continuous entropy for
               continuous HMMs */
            if (continuous != 1) {
	        for (k = 0; k < n_density; k++) {
	    	    dist[j][k] = mixw_occ[s][j][k] * norm;
		    if (dist[j][k] < mwfloor)
		        dist[j][k] = mwfloor;
	        }

	        s_wt_ent += dnom[j] * ent_d(dist[j], n_density);
            }
            else {
	        s_wt_ent += dnom[j] * ent_cont(lmeans[s][j], lvars[s][j], veclen[j]);
            }
	}

	wt_ent += stwt[s] * s_wt_ent;
    }

    node->node_id = node_id;
    l_id = ckd_calloc(n_id, sizeof(uint32));
    for (j = 0; j < n_id; j++) {
	l_id[j] = id[j];
    }
    node->id = l_id;
    node->n_id = n_id;
    node->mixw_occ = mixw_occ;
    if (continuous == 1) {
        node->means = lmeans;
        node->vars = lvars;
    }
    node->occ = occ;
    node->wt_ent = wt_ent;

    ckd_free_2d((void **)dist);
    ckd_free((void *)dnom);

    return S3_SUCCESS;
}